

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O0

Vec_Int_t * Acec_MultDetectInputs(Gia_Man_t *p,Vec_Wec_t *vLeafLits,Vec_Wec_t *vRootLits)

{
  long lVar1;
  FILE *pFile;
  Vec_Wec_t *p_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  word local_70;
  word Truth;
  int Entry;
  int j;
  int iObj;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vCounts;
  Vec_Int_t *vRanks;
  Vec_Wrd_t *vTemp;
  Vec_Int_t *vSupp;
  Vec_Int_t *vInputs;
  Vec_Wec_t *vRootLits_local;
  Vec_Wec_t *vLeafLits_local;
  Gia_Man_t *p_local;
  
  vInputs = (Vec_Int_t *)vRootLits;
  vRootLits_local = vLeafLits;
  vLeafLits_local = (Vec_Wec_t *)p;
  vSupp = Vec_IntAlloc(100);
  vTemp = (Vec_Wrd_t *)Vec_IntAlloc(100);
  iVar2 = Gia_ManObjNum((Gia_Man_t *)vLeafLits_local);
  vRanks = (Vec_Int_t *)Vec_WrdStart(iVar2);
  iVar2 = Gia_ManObjNum((Gia_Man_t *)vLeafLits_local);
  vCounts = Vec_IntStart(iVar2);
  iVar2 = Gia_ManObjNum((Gia_Man_t *)vLeafLits_local);
  vLevel = Vec_IntStart(iVar2);
  lVar1._0_4_ = vLeafLits_local[9].nCap;
  lVar1._4_4_ = vLeafLits_local[9].nSize;
  if (lVar1 != 0) {
    free(*(void **)(vLeafLits_local + 9));
    vLeafLits_local[9].nCap = 0;
    vLeafLits_local[9].nSize = 0;
  }
  Gia_ManCreateRefs((Gia_Man_t *)vLeafLits_local);
  iLit = 0;
  while( true ) {
    iVar2 = iLit;
    iVar3 = Vec_IntSize(*(Vec_Int_t **)(vLeafLits_local + 4));
    p_00 = vLeafLits_local;
    bVar8 = false;
    if (iVar2 < iVar3) {
      pGVar7 = Gia_ManCi((Gia_Man_t *)vLeafLits_local,iLit);
      Entry = Gia_ObjId((Gia_Man_t *)p_00,pGVar7);
      bVar8 = Entry != 0;
    }
    iVar2 = Entry;
    if (!bVar8) break;
    uVar4 = Gia_ObjRefNumId((Gia_Man_t *)vLeafLits_local,Entry);
    printf("%d=%d ",(ulong)(uint)iVar2,(ulong)uVar4);
    iLit = iLit + 1;
  }
  printf("\n");
  for (Entry = 0; Entry < *(int *)&vLeafLits_local[1].pArray; Entry = Entry + 1) {
    pGVar7 = Gia_ManObj((Gia_Man_t *)vLeafLits_local,Entry);
    iVar2 = Gia_ObjIsAnd(pGVar7);
    if ((iVar2 != 0) &&
       (iVar3 = Gia_ObjRefNumId((Gia_Man_t *)vLeafLits_local,Entry), iVar2 = Entry, 3 < iVar3)) {
      uVar4 = Gia_ObjRefNumId((Gia_Man_t *)vLeafLits_local,Entry);
      printf("%d=%d ",(ulong)(uint)iVar2,(ulong)uVar4);
    }
  }
  printf("\n");
  for (iLit = 0; iVar2 = iLit, iVar3 = Vec_WecSize(vRootLits_local), iVar2 < iVar3; iLit = iLit + 1)
  {
    _k = Vec_WecEntry(vRootLits_local,iLit);
    for (iObj = 0; iVar2 = iObj, iVar3 = Vec_IntSize(_k), iVar2 < iVar3; iObj = iObj + 1) {
      j = Vec_IntEntry(_k,iObj);
      local_70 = Gia_ObjComputeTruth6Cis
                           ((Gia_Man_t *)vLeafLits_local,j,(Vec_Int_t *)vTemp,(Vec_Wrd_t *)vRanks);
      iVar2 = Vec_IntSize((Vec_Int_t *)vTemp);
      if (-1 < iVar2) {
        uVar4 = Abc_Lit2Var(j);
        printf("Leaf = %4d : ",(ulong)uVar4);
        printf("Rank = %2d  ",(ulong)(uint)iLit);
        uVar4 = Vec_IntSize((Vec_Int_t *)vTemp);
        printf("Supp = %2d  ",(ulong)uVar4);
        pFile = _stdout;
        iVar2 = Vec_IntSize((Vec_Int_t *)vTemp);
        Extra_PrintHex(pFile,(uint *)&local_70,iVar2);
        iVar2 = Vec_IntSize((Vec_Int_t *)vTemp);
        if (iVar2 == 4) {
          printf("    ");
        }
        iVar2 = Vec_IntSize((Vec_Int_t *)vTemp);
        if (iVar2 == 3) {
          printf("      ");
        }
        iVar2 = Vec_IntSize((Vec_Int_t *)vTemp);
        if (iVar2 < 3) {
          printf("       ");
        }
        printf("  ");
        Vec_IntPrint((Vec_Int_t *)vTemp);
      }
      for (Truth._4_4_ = 0; iVar2 = Truth._4_4_, iVar5 = Vec_IntSize((Vec_Int_t *)vTemp),
          iVar3 = iObj, iVar2 < iVar5; Truth._4_4_ = Truth._4_4_ + 1) {
        Truth._0_4_ = Vec_IntEntry((Vec_Int_t *)vTemp,Truth._4_4_);
        Vec_IntAddToEntry(vCounts,(uint)Truth,iLit);
        Vec_IntAddToEntry(vLevel,(uint)Truth,1);
      }
      iVar2 = Vec_IntSize(_k);
      if (iVar3 == iVar2 + -1) {
        printf("\n");
      }
    }
  }
  for (Truth._4_4_ = 0; uVar4 = Truth._4_4_, iVar2 = Vec_IntSize(vLevel), (int)uVar4 < iVar2;
      Truth._4_4_ = Truth._4_4_ + 1) {
    uVar6 = Vec_IntEntry(vLevel,Truth._4_4_);
    uVar4 = Truth._4_4_;
    Truth._0_4_ = uVar6;
    if (uVar6 != 0) {
      iVar2 = Vec_IntEntry(vCounts,Truth._4_4_);
      printf("%d=%d(%.2f) ",((double)iVar2 * 1.0) / (double)(int)(uint)Truth,(ulong)uVar4,
             (ulong)uVar6);
    }
  }
  printf("\n");
  Vec_IntFree((Vec_Int_t *)vTemp);
  Vec_WrdFree((Vec_Wrd_t *)vRanks);
  Vec_IntFree(vCounts);
  Vec_IntFree(vLevel);
  return vSupp;
}

Assistant:

Vec_Int_t * Acec_MultDetectInputs( Gia_Man_t * p, Vec_Wec_t * vLeafLits, Vec_Wec_t * vRootLits )
{
    Vec_Int_t * vInputs = Vec_IntAlloc( 100 );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vRanks  = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vCounts = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, iLit, iObj, j, Entry;

    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    Gia_ManForEachCiId( p, iObj, i )
        printf( "%d=%d ", iObj, Gia_ObjRefNumId(p, iObj) );
    printf( "\n" );
    Gia_ManForEachAndId( p, iObj )
        if ( Gia_ObjRefNumId(p, iObj) >= 4 )
            printf( "%d=%d ", iObj, Gia_ObjRefNumId(p, iObj) );
    printf( "\n" );

    Vec_WecForEachLevel( vLeafLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            word Truth = Gia_ObjComputeTruth6Cis( p, iLit, vSupp, vTemp );
            if ( Vec_IntSize(vSupp) >= 0 )
            {
                printf( "Leaf = %4d : ", Abc_Lit2Var(iLit) );
                printf( "Rank = %2d  ", i );
                printf( "Supp = %2d  ", Vec_IntSize(vSupp) );
                Extra_PrintHex( stdout, (unsigned*)&Truth, Vec_IntSize(vSupp) );
                if ( Vec_IntSize(vSupp) == 4 ) printf( "    " );
                if ( Vec_IntSize(vSupp) == 3 ) printf( "      " );
                if ( Vec_IntSize(vSupp) <= 2 ) printf( "       " );
                printf( "  " );
                Vec_IntPrint( vSupp );
                /*
                if ( Truth == 0xF335ACC0F335ACC0 )
                {
                    int iObj = Abc_Lit2Var(iLit);
                    Gia_Man_t * pGia0 = Gia_ManDupAndCones( p, &iObj, 1, 1 );
                    Gia_ManShow( pGia0, NULL, 0, 0, 0 );
                    Gia_ManStop( pGia0 );
                }
                */
            }
            // support rank counts
            Vec_IntForEachEntry( vSupp, Entry, j )
            {
                Vec_IntAddToEntry( vRanks, Entry, i );
                Vec_IntAddToEntry( vCounts, Entry, 1 );
            }
            if ( k == Vec_IntSize(vLevel)-1 )
                printf( "\n" );
        }

    Vec_IntForEachEntry( vCounts, Entry, j )
        if ( Entry )
            printf( "%d=%d(%.2f) ", j, Entry, 1.0*Vec_IntEntry(vRanks, j)/Entry );
    printf( "\n" );

    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    Vec_IntFree( vRanks );
    Vec_IntFree( vCounts );
    return vInputs;
}